

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  char *pcVar1;
  pointer pcVar2;
  Option *pOVar3;
  undefined8 uVar4;
  size_t sVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  stringstream out;
  undefined1 local_2c0 [40];
  size_t local_298;
  string local_290;
  FormatterBase *local_270;
  Option *local_268;
  string *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((opt->option_text_)._M_string_length == 0) {
    local_270 = &this->super_FormatterBase;
    if (opt->type_size_min_ != 0) {
      Option::get_type_name_abi_cxx11_((string *)local_2c0,opt);
      uVar4 = local_2c0._8_8_;
      pcVar1 = local_2c0 + 0x10;
      if ((char *)local_2c0._0_8_ != pcVar1) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if (uVar4 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        Option::get_type_name_abi_cxx11_(&local_1d8,opt);
        FormatterBase::get_label((string *)local_2c0,local_270,&local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
        if ((char *)local_2c0._0_8_ != pcVar1) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar2 = (opt->default_str_)._M_dataplus._M_p;
      local_2c0._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,pcVar2,pcVar2 + (opt->default_str_)._M_string_length);
      uVar4 = local_2c0._8_8_;
      if ((char *)local_2c0._0_8_ != pcVar1) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if (uVar4 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"=",1);
        pcVar2 = (opt->default_str_)._M_dataplus._M_p;
        local_2c0._0_8_ = pcVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,pcVar2,pcVar2 + (opt->default_str_)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
        if ((char *)local_2c0._0_8_ != pcVar1) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
      }
      if (opt->expected_max_ == 0x20000000) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ...",4);
      }
      else if (1 < opt->expected_min_) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," x ",3);
        ::std::ostream::operator<<((ostream *)local_1a8,opt->expected_min_);
      }
      if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
        FormatterBase::get_label((string *)local_2c0,local_270,&local_1f8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
        if ((char *)local_2c0._0_8_ != pcVar1) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pcVar1 = local_2c0 + 0x10;
    pcVar2 = (opt->envname_)._M_dataplus._M_p;
    local_2c0._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c0,pcVar2,pcVar2 + (opt->envname_)._M_string_length);
    uVar4 = local_2c0._8_8_;
    if ((char *)local_2c0._0_8_ != pcVar1) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    local_268 = opt;
    if (uVar4 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (",2);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Env","");
      FormatterBase::get_label((string *)local_2c0,local_270,&local_218);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      pcVar2 = (local_268->envname_)._M_dataplus._M_p;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,pcVar2,pcVar2 + (local_268->envname_)._M_string_length);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      opt = local_268;
      if ((char *)local_2c0._0_8_ != pcVar1) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                *)local_2c0,&(opt->needs_)._M_t);
    sVar5 = local_298;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                 *)local_2c0);
    local_260 = __return_storage_ptr__;
    if (sVar5 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Needs","");
      FormatterBase::get_label((string *)local_2c0,local_270,&local_238);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                  *)local_2c0,&(opt->needs_)._M_t);
      if ((_Rb_tree_node_base *)local_2c0._24_8_ != (_Rb_tree_node_base *)(local_2c0 + 8)) {
        p_Var7 = (_Rb_tree_node_base *)local_2c0._24_8_;
        do {
          pOVar3 = *(Option **)(p_Var7 + 1);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          Option::get_name_abi_cxx11_(&local_290,pOVar3,false,false);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)(local_2c0 + 8));
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                   *)local_2c0);
      opt = local_268;
    }
    __return_storage_ptr__ = local_260;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                *)local_2c0,&(opt->excludes_)._M_t);
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                 *)local_2c0);
    if (local_298 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Excludes","");
      FormatterBase::get_label((string *)local_2c0,local_270,&local_258);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                  *)local_2c0,&(opt->excludes_)._M_t);
      if ((_Rb_tree_node_base *)local_2c0._24_8_ != (_Rb_tree_node_base *)(local_2c0 + 8)) {
        p_Var7 = (_Rb_tree_node_base *)local_2c0._24_8_;
        do {
          pOVar3 = *(Option **)(p_Var7 + 1);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          Option::get_name_abi_cxx11_(&local_290,pOVar3,false,false);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)(local_2c0 + 8));
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                   *)local_2c0);
      __return_storage_ptr__ = local_260;
    }
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(opt->option_text_)._M_dataplus._M_p,(opt->option_text_)._M_string_length);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << "=" << opt->get_default_str();
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}